

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCount.h
# Opt level: O2

int If_LogCreateMux(Vec_Int_t *vAig,int iLitC,int iLit1,int iLit0,int nSuppAll)

{
  int iVar1;
  int iVar2;
  
  iVar1 = If_LogCreateAnd(vAig,iLitC,iLit1,nSuppAll);
  iVar2 = Abc_LitNot(iLitC);
  iVar2 = If_LogCreateAnd(vAig,iVar2,iLit0,nSuppAll);
  iVar1 = Abc_LitNot(iVar1);
  iVar2 = Abc_LitNot(iVar2);
  iVar1 = If_LogCreateAnd(vAig,iVar1,iVar2,nSuppAll);
  iVar1 = Abc_LitNot(iVar1);
  return iVar1;
}

Assistant:

static inline int If_LogCreateMux( Vec_Int_t * vAig, int iLitC, int iLit1, int iLit0, int nSuppAll )
{
    int iFanLit0 = If_LogCreateAnd( vAig, iLitC, iLit1, nSuppAll );
    int iFanLit1 = If_LogCreateAnd( vAig, Abc_LitNot(iLitC), iLit0, nSuppAll );
    int iResLit  = If_LogCreateAnd( vAig, Abc_LitNot(iFanLit0), Abc_LitNot(iFanLit1), nSuppAll );
    return Abc_LitNot(iResLit);
}